

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::ServiceDescriptorProto::IsInitialized(ServiceDescriptorProto *this)

{
  char cVar1;
  int iVar2;
  ServiceOptions *pSVar3;
  long lVar4;
  
  if (0 < (this->method_).super_RepeatedPtrFieldBase.current_size_) {
    lVar4 = 0;
    do {
      cVar1 = (**(code **)(*(this->method_).super_RepeatedPtrFieldBase.elements_[lVar4] + 0x28))();
      if (cVar1 == '\0') {
        return false;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->method_).super_RepeatedPtrFieldBase.current_size_);
  }
  if ((this->_has_bits_[0] & 4) != 0) {
    pSVar3 = this->options_;
    if (pSVar3 == (ServiceOptions *)0x0) {
      pSVar3 = *(ServiceOptions **)(default_instance_ + 0x30);
    }
    iVar2 = (*(pSVar3->super_Message).super_MessageLite._vptr_MessageLite[5])();
    if ((char)iVar2 == '\0') {
      return false;
    }
  }
  return true;
}

Assistant:

bool ServiceDescriptorProto::IsInitialized() const {

  for (int i = 0; i < method_size(); i++) {
    if (!this->method(i).IsInitialized()) return false;
  }
  if (has_options()) {
    if (!this->options().IsInitialized()) return false;
  }
  return true;
}